

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgExoticQuadrature.hpp
# Opt level: O0

void TasGrid::getGaussNodesAndWeights<true>
               (int n,vector<double,_std::allocator<double>_> *ref_points,
               vector<double,_std::allocator<double>_> *ref_weights,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *points_cache,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *weights_cache)

{
  allocator<double> *this;
  double dVar1;
  ulong uVar2;
  bool bVar3;
  size_type sVar4;
  size_type sVar5;
  reference pvVar6;
  const_reference pvVar7;
  reference pvVar8;
  reference this_00;
  pointer pdVar9;
  vector *pvVar10;
  vector *pvVar11;
  invalid_argument *this_01;
  const_iterator __first;
  const_iterator __last;
  iterator __result;
  double dVar12;
  anon_class_16_2_2767434e __unary_op;
  undefined1 local_198 [8];
  vector<double,_std::allocator<double>_> dummy_offdiag;
  vector<double,_std::allocator<double>_> dummy_diag;
  size_t k;
  size_t j_1;
  value_type_conflict1 local_150;
  vector<double,_std::allocator<double>_> local_148;
  vector<double,_std::allocator<double>_> local_130;
  double local_118;
  ulong local_110;
  size_t j;
  double sqr_offdiag_denm;
  double sqr_offdiag_numr;
  int local_ec;
  undefined1 local_e8 [4];
  int i;
  vector<double,_std::allocator<double>_> offdiag;
  vector<double,_std::allocator<double>_> diag;
  value_type_conflict1 local_b0;
  undefined1 local_a8 [8];
  vector<double,_std::allocator<double>_> poly_vals;
  allocator<double> local_79;
  value_type_conflict1 local_78;
  undefined1 local_70 [8];
  vector<double,_std::allocator<double>_> poly_m1_vals;
  double *w;
  const_iterator __end2;
  const_iterator __begin2;
  vector<double,_std::allocator<double>_> *__range2;
  double mu0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *weights_cache_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *points_cache_local;
  vector<double,_std::allocator<double>_> *ref_weights_local;
  vector<double,_std::allocator<double>_> *ref_points_local;
  int n_local;
  
  if (gauss_quadrature_version == 1) {
    gauss_quadrature_version = 2;
  }
  sVar4 = std::vector<double,_std::allocator<double>_>::size(ref_points);
  sVar5 = std::vector<double,_std::allocator<double>_>::size(ref_weights);
  if (sVar4 != sVar5) {
    __assert_fail("ref_points.size() == ref_weights.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/Addons/tsgExoticQuadrature.hpp"
                  ,0x9e,
                  "void TasGrid::getGaussNodesAndWeights(const int, const std::vector<double> &, const std::vector<double> &, std::vector<std::vector<double>> &, std::vector<std::vector<double>> &) [is_symmetric = true]"
                 );
  }
  sVar4 = std::vector<double,_std::allocator<double>_>::size(ref_points);
  if (sVar4 == 0) {
    __assert_fail("ref_points.size() > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/Addons/tsgExoticQuadrature.hpp"
                  ,0x9f,
                  "void TasGrid::getGaussNodesAndWeights(const int, const std::vector<double> &, const std::vector<double> &, std::vector<std::vector<double>> &, std::vector<std::vector<double>> &) [is_symmetric = true]"
                 );
  }
  __range2 = (vector<double,_std::allocator<double>_> *)0x0;
  __end2 = std::vector<double,_std::allocator<double>_>::begin(ref_weights);
  w = (double *)std::vector<double,_std::allocator<double>_>::end(ref_weights);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                     *)&w), bVar3) {
    poly_m1_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage =
         __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
         ::operator*(&__end2);
    __range2 = (vector<double,_std::allocator<double>_> *)
               (*poly_m1_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + (double)__range2);
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end2);
  }
  sVar4 = std::vector<double,_std::allocator<double>_>::size(ref_points);
  local_78 = 0.0;
  std::allocator<double>::allocator(&local_79);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_70,sVar4,&local_78,&local_79);
  std::allocator<double>::~allocator(&local_79);
  sVar4 = std::vector<double,_std::allocator<double>_>::size(ref_points);
  local_b0 = 1.0;
  this = (allocator<double> *)
         ((long)&diag.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(this);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_a8,sVar4,&local_b0,this);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&diag.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &offdiag.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_e8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(points_cache,(long)n);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(weights_cache,(long)n);
  local_ec = 0;
  do {
    if (n <= local_ec) {
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_e8);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 &offdiag.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_a8);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_70);
      return;
    }
    sqr_offdiag_numr = 0.0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               &offdiag.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&sqr_offdiag_numr);
    if (0 < local_ec) {
      sqr_offdiag_denm = 0.0;
      j = 0;
      for (local_110 = 0; uVar2 = local_110,
          sVar4 = std::vector<double,_std::allocator<double>_>::size(ref_points), uVar2 < sVar4;
          local_110 = local_110 + 1) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_a8,local_110);
        dVar1 = *pvVar6;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_a8,local_110);
        dVar12 = *pvVar6;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](ref_weights,local_110);
        sqr_offdiag_denm = dVar1 * dVar12 * *pvVar7 + sqr_offdiag_denm;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_70,local_110);
        dVar1 = *pvVar6;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_70,local_110);
        dVar12 = *pvVar6;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](ref_weights,local_110);
        j = (size_t)(dVar1 * dVar12 * *pvVar7 + (double)j);
      }
      local_118 = sqrt(sqr_offdiag_denm / (double)j);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)local_e8,&local_118);
    }
    if (gauss_quadrature_version == 1) {
      TasGrid::TasmanianTridiagonalSolver::getSymmetricEigenvalues
                ((int)&local_130,(vector *)(ulong)(local_ec + 1),
                 (vector *)
                 &offdiag.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      pvVar8 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](points_cache,(long)local_ec);
      std::vector<double,_std::allocator<double>_>::operator=(pvVar8,&local_130);
      std::vector<double,_std::allocator<double>_>::~vector(&local_130);
      pvVar8 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](points_cache,(long)local_ec);
      sVar4 = std::vector<double,_std::allocator<double>_>::size(pvVar8);
      if ((sVar4 & 1) == 1) {
        pvVar8 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](points_cache,(long)local_ec);
        this_00 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](points_cache,(long)local_ec);
        sVar4 = std::vector<double,_std::allocator<double>_>::size(this_00);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,sVar4 - 1 >> 1);
        *pvVar6 = 0.0;
      }
      pvVar8 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](points_cache,(long)local_ec);
      sVar4 = std::vector<double,_std::allocator<double>_>::size(pvVar8);
      local_150 = 0.0;
      std::allocator<double>::allocator((allocator<double> *)((long)&j_1 + 7));
      std::vector<double,_std::allocator<double>_>::vector
                (&local_148,sVar4,&local_150,(allocator<double> *)((long)&j_1 + 7));
      pvVar8 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](weights_cache,(long)local_ec);
      std::vector<double,_std::allocator<double>_>::operator=(pvVar8,&local_148);
      std::vector<double,_std::allocator<double>_>::~vector(&local_148);
      std::allocator<double>::~allocator((allocator<double> *)((long)&j_1 + 7));
      k = 0;
      while( true ) {
        pvVar8 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](points_cache,(long)local_ec);
        sVar4 = std::vector<double,_std::allocator<double>_>::size(pvVar8);
        if (sVar4 <= k) break;
        for (dummy_diag.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pdVar9 = (pointer)std::vector<double,_std::allocator<double>_>::size(ref_points),
            dummy_diag.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage < pdVar9;
            dummy_diag.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)((long)dummy_diag.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
          pvVar8 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](points_cache,(long)local_ec);
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (ref_points,
                              (size_type)
                              dummy_diag.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage);
          dVar12 = lagrange_eval(k,pvVar8,*pvVar7);
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (ref_weights,
                              (size_type)
                              dummy_diag.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage);
          dVar1 = *pvVar7;
          pvVar8 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](weights_cache,(long)local_ec);
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,k);
          *pvVar6 = dVar12 * dVar1 + *pvVar6;
        }
        k = k + 1;
      }
    }
    else {
      if (gauss_quadrature_version != 2) {
        this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (this_01,"ERROR: gauss_quadrature_version must be a valid number!");
        __cxa_throw(this_01,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 &dummy_offdiag.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<double,_std::allocator<double>_> *)
                 &offdiag.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_198,
                 (vector<double,_std::allocator<double>_> *)local_e8);
      pvVar10 = (vector *)
                std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](points_cache,(long)local_ec);
      pvVar11 = (vector *)
                std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](weights_cache,(long)local_ec);
      TasGrid::TasmanianTridiagonalSolver::decompose
                ((vector *)
                 &dummy_offdiag.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(vector *)local_198,(double)__range2,
                 pvVar10,pvVar11);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_198);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 &dummy_offdiag.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    std::swap<double,std::allocator<double>>
              ((vector<double,_std::allocator<double>_> *)local_70,
               (vector<double,_std::allocator<double>_> *)local_a8);
    __first = std::vector<double,_std::allocator<double>_>::begin(ref_points);
    __last = std::vector<double,_std::allocator<double>_>::end(ref_points);
    __result = std::vector<double,_std::allocator<double>_>::begin
                         ((vector<double,_std::allocator<double>_> *)local_a8);
    __unary_op.i = local_ec;
    __unary_op.points_cache = points_cache;
    __unary_op._12_4_ = 0;
    std::
    transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,TasGrid::getGaussNodesAndWeights<true>(int,std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>const&,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>&,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>&)::_lambda(double)_1_>
              ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               __first._M_current,
               (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               __last._M_current,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               __result._M_current,__unary_op);
    local_ec = local_ec + 1;
  } while( true );
}

Assistant:

inline void getGaussNodesAndWeights(const int n, const std::vector<double> &ref_points, const std::vector<double> &ref_weights,
                                    std::vector<std::vector<double>> &points_cache, std::vector<std::vector<double>> &weights_cache) {
    #ifndef Tasmanian_ENABLE_BLAS
    // If BLAS is not enabled, we must use an implementation that does not require it.
    if (gauss_quadrature_version == 1) {
        gauss_quadrature_version = 2;
    }
    #endif
    // Compute the roots incrementally.
    assert(ref_points.size() == ref_weights.size());
    assert(ref_points.size() > 0);
    double mu0 = 0.0;
    for (auto &w : ref_weights) mu0 += w;
    std::vector<double> poly_m1_vals(ref_points.size(), 0.0), poly_vals(ref_points.size(), 1.0);
    std::vector<double> diag, offdiag;
    points_cache.resize(n);
    weights_cache.resize(n);
    for (int i=0; i<n; i++) {
        // Form the diagonal and offdiagonal vectors of the Jacobi matrix.
        if (is_symmetric) {
            diag.push_back(0.0);
        } else {
            double diag_numr = 0.0;
            double diag_denm = 0.0;
            for (size_t j=0; j<ref_points.size(); j++) {
            diag_numr += ref_points[j] * (poly_vals[j] * poly_vals[j]) * ref_weights[j];
            diag_denm += (poly_vals[j] * poly_vals[j]) * ref_weights[j];
            }
            diag.push_back(diag_numr / diag_denm);
        }
        if (i >= 1) {
            double sqr_offdiag_numr = 0.0;
            double sqr_offdiag_denm = 0.0;
            for (size_t j=0; j<ref_points.size(); j++) {
                sqr_offdiag_numr += (poly_vals[j] * poly_vals[j]) * ref_weights[j];
                sqr_offdiag_denm += (poly_m1_vals[j] * poly_m1_vals[j])  * ref_weights[j];
            }
            offdiag.push_back(std::sqrt(sqr_offdiag_numr / sqr_offdiag_denm));
        }
        // Compute the Gauss points and weights.
        if (gauss_quadrature_version == 1) {
            // Use LAPACK to obtain the Gauss points, and use the reference points and weights to obtain the Gauss weights.
            // Note that the matrix is always symmetric even if the weights function is not.
            points_cache[i] = TasmanianTridiagonalSolver::getSymmetricEigenvalues(i+1, diag, offdiag);
            if (points_cache[i].size() % 2 == 1 && is_symmetric) {
                points_cache[i][(points_cache[i].size() - 1) / 2] = 0.0;
            }
            weights_cache[i] = std::vector<double>(points_cache[i].size(), 0.0);
            for (size_t j=0; j<points_cache[i].size(); j++) {
                // Integrate the function l_j(x) according to the measure induced by the function [weight_fn(x) + shift].
                for (size_t k=0; k<ref_points.size(); k++) {
                    weights_cache[i][j] += lagrange_eval(j, points_cache[i], ref_points[k]) * ref_weights[k];
                }
            }
        } else if (gauss_quadrature_version == 2) {
            // Use TasmanianTridiagonalSolver::decompose().
            std::vector<double> dummy_diag = diag;
            std::vector<double> dummy_offdiag = offdiag;
            TasmanianTridiagonalSolver::decompose(dummy_diag, dummy_offdiag, mu0, points_cache[i], weights_cache[i]);
        } else {
            throw std::invalid_argument("ERROR: gauss_quadrature_version must be a valid number!");
        }
        // Update the values of the polynomials at ref_points.
        std::swap(poly_m1_vals, poly_vals);
        std::transform(ref_points.begin(), ref_points.end(), poly_vals.begin(),
                       [&points_cache, i](double x){return poly_eval(points_cache[i], x);});
    }
}